

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructorCache.h
# Opt level: O3

void __thiscall Js::ConstructorCache::InvalidateAsGuard(ConstructorCache *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JitPolyEquivalentTypeGuard *this_00;
  uint8 i;
  
  if (this == (ConstructorCache *)&DefaultInstance) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/ConstructorCache.h"
                                ,0xe5,"(!IsDefault(this))","!IsDefault(this)");
    if (!bVar2) goto LAB_007789f6;
    *puVar3 = 0;
  }
  (this->super_PropertyGuard).value = 0;
  if ((this->super_PropertyGuard).isPoly == true) {
    this_00 = PropertyGuard::AsPolyTypeCheckGuard(&this->super_PropertyGuard);
    i = '\0';
    do {
      JitPolyEquivalentTypeGuard::Invalidate(this_00,i);
      i = i + '\x01';
    } while (i != '\b');
  }
  if ((this->content).pendingType.ptr != (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/ConstructorCache.h"
                                ,0xe8,"(this->content.pendingType == nullptr)",
                                "this->content.pendingType == nullptr");
    if (!bVar2) goto LAB_007789f6;
    *puVar3 = 0;
  }
  if (((this->super_PropertyGuard).value != 0) || (((this->content).field_0x14 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/ConstructorCache.h"
                                ,0xe9,"(IsInvalidated())","IsInvalidated()");
    if (!bVar2) goto LAB_007789f6;
    *puVar3 = 0;
  }
  bVar2 = IsConsistent(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/ConstructorCache.h"
                                ,0xea,"(IsConsistent())","IsConsistent()");
    if (!bVar2) {
LAB_007789f6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void InvalidateAsGuard()
        {
            Assert(!IsDefault(this));
            Invalidate();
            // Make sure we don't leak the types.
            Assert(this->content.pendingType == nullptr);
            Assert(IsInvalidated());
            Assert(IsConsistent());
        }